

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O3

Ref<Lodtalk::ByteString> *
Lodtalk::ByteString::fromNative
          (Ref<Lodtalk::ByteString> *__return_storage_ptr__,VMContext *context,string *native)

{
  ObjectHeader *pOVar1;
  
  pOVar1 = VMContext::newObject(context,0,native->_M_string_length,OF_INDEXABLE_8,0x42,-1);
  memcpy(pOVar1 + 1,(native->_M_dataplus)._M_p,native->_M_string_length);
  (__return_storage_ptr__->reference).oop.field_0.pointer = (uint8_t *)&NilObject;
  (__return_storage_ptr__->reference).context_ = context;
  OopRef::registerSelf(&__return_storage_ptr__->reference);
  (__return_storage_ptr__->reference).oop.field_0.header = pOVar1;
  return __return_storage_ptr__;
}

Assistant:

Ref<ByteString> ByteString::fromNative(VMContext *context, const std::string &native)
{
	auto result = basicNativeNew(context, native.size());
	memcpy(result->getFirstFieldPointer(), native.data(), native.size());
	return Ref<ByteString> (context, reinterpret_cast<ByteString*> (result));
}